

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_20::~ChElementHexaCorot_20(ChElementHexaCorot_20 *this)

{
  ~ChElementHexaCorot_20(this,&VTT);
  operator_delete(this,0x108);
  return;
}

Assistant:

ChElementHexaCorot_20::~ChElementHexaCorot_20() {
    delete ir;
    for (auto gpoint : GpVector)
        delete gpoint;
    GpVector.clear();
}